

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlNode * __thiscall TiXmlDeclaration::Clone(TiXmlDeclaration *this)

{
  TiXmlDeclaration *clone;
  TiXmlDeclaration *this_local;
  
  this_local = (TiXmlDeclaration *)operator_new(0x68);
  TiXmlDeclaration(this_local);
  if (this_local == (TiXmlDeclaration *)0x0) {
    this_local = (TiXmlDeclaration *)0x0;
  }
  else {
    CopyTo(this,this_local);
  }
  return &this_local->super_TiXmlNode;
}

Assistant:

TiXmlNode* TiXmlDeclaration::Clone() const
{	
	TiXmlDeclaration* clone = new TiXmlDeclaration();

	if ( !clone )
		return 0;

	CopyTo( clone );
	return clone;
}